

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

Char __thiscall cppforth::Forth::dataSpaceAt(Forth *this,Cell index)

{
  pointer puVar1;
  pointer pVVar2;
  ulong uVar3;
  
  pVVar2 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pVVar2 == (this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return '\0';
    }
    uVar3 = (ulong)(index - pVVar2->start);
    if ((pVVar2->start <= index) && (index < pVVar2->end)) break;
    pVVar2 = pVVar2 + 1;
  }
  puVar1 = (pVVar2->segment).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(pVVar2->segment).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
    return puVar1[uVar3];
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

Char dataSpaceAt(Cell index){
			for (auto it = VirtualMemory.begin(), itend=VirtualMemory.end(); it != itend ; ++it){
				if ((*it).start <= index && (*it).end > index){
					return (*it).segment.at(index - (*it).start);
				}
			}
			return Char(0); // all memory is filled by 0x00
		}